

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::buildStateTable(RBBITableBuilder *this)

{
  uint lastInputSymbol;
  UBool UVar1;
  int32_t iVar2;
  RBBIStateDescriptor *this_00;
  UVector *pUVar3;
  RBBIStateDescriptor *this_01;
  char *pcVar4;
  int *piVar5;
  RBBIStateDescriptor *pRVar6;
  void *pvVar7;
  UErrorCode *pUVar8;
  int iVar9;
  RBBIStateDescriptor *in_RSI;
  uint uVar10;
  int32_t index;
  RBBIStateDescriptor *local_50;
  int local_44;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  this_00 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
  if (this_00 == (RBBIStateDescriptor *)0x0) {
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    UMemory::operator_delete((UMemory *)0x0,in_RSI);
    goto LAB_002a24a8;
  }
  lastInputSymbol = iVar2 - 1;
  in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
  RBBIStateDescriptor::RBBIStateDescriptor(this_00,lastInputSymbol,this->fStatus);
  pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
  if (pUVar3 == (UVector *)0x0) {
    this_00->fPositions = (UVector *)0x0;
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
LAB_002a2495:
    this_01 = (RBBIStateDescriptor *)0x0;
  }
  else {
    in_RSI = (RBBIStateDescriptor *)this->fStatus;
    UVector::UVector(pUVar3,(UErrorCode *)in_RSI);
    this_00->fPositions = pUVar3;
    if ((U_ZERO_ERROR < *this->fStatus) ||
       (in_RSI = this_00, UVector::addElement(this->fDStates,this_00,this->fStatus),
       U_ZERO_ERROR < *this->fStatus)) goto LAB_002a2495;
    this_01 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
    if (this_01 == (RBBIStateDescriptor *)0x0) {
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
      RBBIStateDescriptor::RBBIStateDescriptor(this_01,lastInputSymbol,this->fStatus);
      if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
        if (pUVar3 == (UVector *)0x0) {
          this_01->fPositions = (UVector *)0x0;
          *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          in_RSI = (RBBIStateDescriptor *)this->fStatus;
          UVector::UVector(pUVar3,(UErrorCode *)in_RSI);
          this_01->fPositions = pUVar3;
          if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            setAdd(this,pUVar3,(*this->fTree)->fFirstPosSet);
            in_RSI = this_01;
            UVector::addElement(this->fDStates,this_01,this->fStatus);
            if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
              pUVar3 = this->fDStates;
              if (pUVar3->count < 2) {
                return;
              }
              iVar9 = 1;
              do {
                while (pcVar4 = (char *)UVector::elementAt(pUVar3,iVar9), *pcVar4 != '\0') {
                  iVar9 = iVar9 + 1;
                  pUVar3 = this->fDStates;
                  if (pUVar3->count <= iVar9) {
                    return;
                  }
                }
                *pcVar4 = '\x01';
                if (1 < iVar2) {
                  local_44 = 1;
                  do {
                    pUVar3 = *(UVector **)(pcVar4 + 0x20);
                    if (0 < pUVar3->count) {
                      local_50 = (RBBIStateDescriptor *)0x0;
                      pRVar6 = (RBBIStateDescriptor *)0x0;
                      do {
                        in_RSI = pRVar6;
                        iVar9 = (int)in_RSI;
                        piVar5 = (int *)UVector::elementAt(pUVar3,iVar9);
                        if ((*piVar5 == 3) && (piVar5[0x1f] == local_44)) {
                          pRVar6 = local_50;
                          if (local_50 == (RBBIStateDescriptor *)0x0) {
                            pRVar6 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x28,0)
                            ;
                            pUVar8 = this->fStatus;
                            in_RSI = local_50;
                            if (pRVar6 == (RBBIStateDescriptor *)0x0) goto LAB_002a2718;
                            UVector::UVector((UVector *)pRVar6,pUVar8);
                          }
                          in_RSI = pRVar6;
                          setAdd(this,(UVector *)pRVar6,*(UVector **)(piVar5 + 0x26));
                          local_50 = pRVar6;
                        }
                        uVar10 = iVar9 + 1;
                        pUVar3 = *(UVector **)(pcVar4 + 0x20);
                        pRVar6 = (RBBIStateDescriptor *)(ulong)uVar10;
                      } while ((int)uVar10 < pUVar3->count);
                      if (local_50 != (RBBIStateDescriptor *)0x0) {
                        pUVar3 = this->fDStates;
                        if (0 < pUVar3->count) {
                          index = 0;
                          do {
                            pvVar7 = UVector::elementAt(pUVar3,index);
                            in_RSI = *(RBBIStateDescriptor **)((long)pvVar7 + 0x20);
                            UVar1 = UVector::equals((UVector *)local_50,(UVector *)in_RSI);
                            if (UVar1 != '\0') {
                              (**(code **)(*(long *)local_50 + 8))();
                              goto LAB_002a26bb;
                            }
                            index = index + 1;
                            pUVar3 = this->fDStates;
                          } while (index < pUVar3->count);
                        }
                        pRVar6 = (RBBIStateDescriptor *)
                                 UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
                        pUVar8 = this->fStatus;
                        if (pRVar6 == (RBBIStateDescriptor *)0x0) {
LAB_002a2718:
                          *pUVar8 = U_MEMORY_ALLOCATION_ERROR;
                        }
                        else {
                          in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
                          RBBIStateDescriptor::RBBIStateDescriptor(pRVar6,lastInputSymbol,pUVar8);
                          pUVar8 = this->fStatus;
                          if (*pUVar8 < U_ILLEGAL_ARGUMENT_ERROR) {
                            pRVar6->fPositions = (UVector *)local_50;
                            UVector::addElement(this->fDStates,pRVar6,pUVar8);
                            if (U_ZERO_ERROR < *this->fStatus) {
                              return;
                            }
                            index = this->fDStates->count + -1;
LAB_002a26bb:
                            UVector32::setElementAt(*(UVector32 **)(pcVar4 + 0x28),index,local_44);
                            goto LAB_002a26d5;
                          }
                        }
                        if (this_01 != (RBBIStateDescriptor *)0x0) goto LAB_002a246a;
                        goto LAB_002a2498;
                      }
                    }
LAB_002a26d5:
                    local_44 = local_44 + 1;
                  } while (local_44 != iVar2);
                }
                pUVar3 = this->fDStates;
                iVar9 = 1;
                if (pUVar3->count < 2) {
                  return;
                }
              } while( true );
            }
          }
        }
      }
LAB_002a246a:
      RBBIStateDescriptor::~RBBIStateDescriptor(this_01);
    }
  }
LAB_002a2498:
  UMemory::operator_delete((UMemory *)this_01,in_RSI);
  RBBIStateDescriptor::~RBBIStateDescriptor(this_00);
LAB_002a24a8:
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  return;
}

Assistant:

void RBBITableBuilder::buildStateTable() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    RBBIStateDescriptor *failState;
    // Set it to NULL to avoid uninitialized warning
    RBBIStateDescriptor *initialState = NULL; 
    //
    // Add a dummy state 0 - the stop state.  Not from Aho.
    int      lastInputSymbol = fRB->fSetBuilder->getNumCharCategories() - 1;
    failState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (failState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        goto ExitBuildSTdeleteall;
    }
    failState->fPositions = new UVector(*fStatus);
    if (failState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (failState->fPositions == NULL || U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    fDStates->addElement(failState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // initially, the only unmarked state in Dstates is firstpos(root),
    //       where toot is the root of the syntax tree for (r)#;
    initialState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (initialState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    initialState->fPositions = new UVector(*fStatus);
    if (initialState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    setAdd(initialState->fPositions, fTree->fFirstPosSet);
    fDStates->addElement(initialState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // while there is an unmarked state T in Dstates do begin
    for (;;) {
        RBBIStateDescriptor *T = NULL;
        int32_t              tx;
        for (tx=1; tx<fDStates->size(); tx++) {
            RBBIStateDescriptor *temp;
            temp = (RBBIStateDescriptor *)fDStates->elementAt(tx);
            if (temp->fMarked == FALSE) {
                T = temp;
                break;
            }
        }
        if (T == NULL) {
            break;
        }

        // mark T;
        T->fMarked = TRUE;

        // for each input symbol a do begin
        int32_t  a;
        for (a = 1; a<=lastInputSymbol; a++) {
            // let U be the set of positions that are in followpos(p)
            //    for some position p in T
            //    such that the symbol at position p is a;
            UVector    *U = NULL;
            RBBINode   *p;
            int32_t     px;
            for (px=0; px<T->fPositions->size(); px++) {
                p = (RBBINode *)T->fPositions->elementAt(px);
                if ((p->fType == RBBINode::leafChar) &&  (p->fVal == a)) {
                    if (U == NULL) {
                        U = new UVector(*fStatus);
                        if (U == NULL) {
                        	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                        	goto ExitBuildSTdeleteall;
                        }
                    }
                    setAdd(U, p->fFollowPos);
                }
            }

            // if U is not empty and not in DStates then
            int32_t  ux = 0;
            UBool    UinDstates = FALSE;
            if (U != NULL) {
                U_ASSERT(U->size() > 0);
                int  ix;
                for (ix=0; ix<fDStates->size(); ix++) {
                    RBBIStateDescriptor *temp2;
                    temp2 = (RBBIStateDescriptor *)fDStates->elementAt(ix);
                    if (setEquals(U, temp2->fPositions)) {
                        delete U;
                        U  = temp2->fPositions;
                        ux = ix;
                        UinDstates = TRUE;
                        break;
                    }
                }

                // Add U as an unmarked state to Dstates
                if (!UinDstates)
                {
                    RBBIStateDescriptor *newState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
                    if (newState == NULL) {
                    	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                    }
                    if (U_FAILURE(*fStatus)) {
                        goto ExitBuildSTdeleteall;
                    }
                    newState->fPositions = U;
                    fDStates->addElement(newState, *fStatus);
                    if (U_FAILURE(*fStatus)) {
                        return;
                    }
                    ux = fDStates->size()-1;
                }

                // Dtran[T, a] := U;
                T->fDtran->setElementAt(ux, a);
            }
        }
    }
    return;
    // delete local pointers only if error occured.
ExitBuildSTdeleteall:
    delete initialState;
    delete failState;
}